

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::ResolveTextureSubresource
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,ITexture *pSrcTexture,
          ITexture *pDstTexture,ResolveTextureSubresourceAttribs *ResolveAttribs)

{
  String *__return_storage_ptr__;
  bool bVar1;
  COMMAND_QUEUE_TYPE CVar2;
  int iVar3;
  int iVar4;
  Char *pCVar5;
  RenderPassVkImpl *pRVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  COMMAND_QUEUE_TYPE Type;
  char (*in_R9) [8];
  TextureDesc *DstTexDesc;
  TextureDesc *SrcTexDesc;
  string msg_4;
  string msg_3;
  undefined1 local_98 [8];
  string msg_2;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  ResolveTextureSubresourceAttribs *ResolveAttribs_local;
  ITexture *pDstTexture_local;
  ITexture *pSrcTexture_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = ResolveAttribs;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar1 = IsDeferred(this);
    if (!bVar1) {
      FormatString<char[79]>
                ((string *)local_48,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"ResolveTextureSubresource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x77e);
      std::__cxx11::string::~string((string *)local_48);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x77e);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar2 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
  if (CVar2 != COMMAND_QUEUE_TYPE_GRAPHICS) {
    __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    FormatString<char[26],char[22],std::__cxx11::string,char[8]>
              ((string *)local_98,(Diligent *)"ResolveTextureSubresource",(char (*) [26])0xf4cb59,
               (char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x77e);
    std::__cxx11::string::~string((string *)local_98);
  }
  pRVar6 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
  if (pRVar6 != (RenderPassVkImpl *)0x0) {
    FormatString<char[71]>
              ((string *)((long)&msg_4.field_2 + 8),
               (char (*) [71])
               "ResolveTextureSubresource command must be used outside of render pass.");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x77f);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  if ((pSrcTexture == (ITexture *)0x0) || (pDstTexture == (ITexture *)0x0)) {
    FormatString<char[38]>
              ((string *)&SrcTexDesc,(char (*) [38])"Src and Dst textures must not be null");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x781);
    std::__cxx11::string::~string((string *)&SrcTexDesc);
  }
  iVar3 = (*(pSrcTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  iVar4 = (*(pDstTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  VerifyResolveTextureSubresourceAttribs
            ((ResolveTextureSubresourceAttribs *)msg.field_2._8_8_,
             (TextureDesc *)CONCAT44(extraout_var,iVar3),
             (TextureDesc *)CONCAT44(extraout_var_00,iVar4));
  (this->m_Stats).CommandCounters.ResolveTextureSubresource =
       (this->m_Stats).CommandCounters.ResolveTextureSubresource + 1;
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::ResolveTextureSubresource(
    ITexture*                               pSrcTexture,
    ITexture*                               pDstTexture,
    const ResolveTextureSubresourceAttribs& ResolveAttribs)
{
#ifdef DILIGENT_DEVELOPMENT
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "ResolveTextureSubresource");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "ResolveTextureSubresource command must be used outside of render pass.");

    DEV_CHECK_ERR(pSrcTexture != nullptr && pDstTexture != nullptr, "Src and Dst textures must not be null");
    const TextureDesc& SrcTexDesc = pSrcTexture->GetDesc();
    const TextureDesc& DstTexDesc = pDstTexture->GetDesc();

    VerifyResolveTextureSubresourceAttribs(ResolveAttribs, SrcTexDesc, DstTexDesc);
#endif
    ++m_Stats.CommandCounters.ResolveTextureSubresource;
}